

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O3

Expression *
slang::ast::UnboundedLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  Compilation *compilation;
  Type *args;
  Expression *pEVar1;
  SourceRange sourceRange;
  SourceRange local_28;
  
  compilation = ((context->scope).ptr)->compilation;
  if (((context->flags).m_bits & 0x202) != 0) {
    args = Compilation::getUnboundedType(compilation);
    local_28 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pEVar1 = &BumpAllocator::
              emplace<slang::ast::UnboundedLiteral,slang::ast::Type_const&,slang::SourceRange>
                        (&compilation->super_BumpAllocator,args,&local_28)->super_Expression;
    return pEVar1;
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0xa10007,sourceRange);
  pEVar1 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar1;
}

Assistant:

Expression& UnboundedLiteral::fromSyntax(const ASTContext& context,
                                         const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::WildcardLiteralExpression);

    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AllowUnboundedLiteral) && !context.inUnevaluatedBranch()) {
        context.addDiag(diag::UnboundedNotAllowed, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    return *comp.emplace<UnboundedLiteral>(comp.getUnboundedType(), syntax.sourceRange());
}